

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O1

optional<jbcoin::ValidatorToken> * __thiscall
jbcoin::ValidatorKeys::createValidatorToken
          (optional<jbcoin::ValidatorToken> *__return_storage_ptr__,ValidatorKeys *this,
          KeyType *keyType)

{
  KeyType type;
  Serializer s;
  string m;
  SecretKey tokenSecret;
  STObject st;
  PublicKey tokenPublic;
  Serializer local_128;
  undefined1 local_110 [32];
  SecretKey local_f0;
  long *local_d0;
  size_t local_c8;
  long local_c0 [2];
  SecretKey local_b0;
  STObject local_90;
  PublicKey local_60;
  
  if ((this->revoked_ == false) && (this->tokenSequence_ < 0xfffffffe)) {
    this->tokenSequence_ = this->tokenSequence_ + 1;
    type = *keyType;
    randomSeed();
    generateSecretKey(&local_b0,type,(Seed *)local_110);
    Seed::~Seed((Seed *)local_110);
    derivePublicKey(&local_60,*keyType,&local_b0);
    STObject::STObject(&local_90,(SField *)sfGeneric);
    STObject::Proxy<jbcoin::STInteger<unsigned_int>_>::Proxy
              ((Proxy<jbcoin::STInteger<unsigned_int>_> *)local_110,&local_90,
               (TypedField<jbcoin::STInteger<unsigned_int>_> *)sfSequence);
    STObject::Proxy<jbcoin::STInteger<unsigned_int>>::assign<unsigned_int&>
              ((Proxy<jbcoin::STInteger<unsigned_int>> *)local_110,&this->tokenSequence_);
    STObject::Proxy<jbcoin::STBlob>::Proxy
              ((Proxy<jbcoin::STBlob> *)local_110,&local_90,
               (TypedField<jbcoin::STBlob> *)sfPublicKey);
    STObject::Proxy<jbcoin::STBlob>::assign<jbcoin::PublicKey&>
              ((Proxy<jbcoin::STBlob> *)local_110,&this->publicKey_);
    STObject::Proxy<jbcoin::STBlob>::Proxy
              ((Proxy<jbcoin::STBlob> *)local_110,&local_90,
               (TypedField<jbcoin::STBlob> *)sfSigningPubKey);
    STObject::Proxy<jbcoin::STBlob>::assign<jbcoin::PublicKey_const&>
              ((Proxy<jbcoin::STBlob> *)local_110,&local_60);
    jbcoin::sign((EVP_PKEY_CTX *)&local_90,(uchar *)&HashPrefix::manifest,
                 (size_t *)(ulong)(uint)*keyType,local_b0.buf_,0x2e2d38);
    jbcoin::sign((EVP_PKEY_CTX *)&local_90,(uchar *)&HashPrefix::manifest,
                 (size_t *)(ulong)(uint)this->keyType_,(this->secretKey_).buf_,0x2e30f8);
    Serializer::Serializer(&local_128,0x100);
    STObject::add(&local_90,&local_128,true);
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               local_128.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_128.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    beast::detail::base64_encode<void>((string *)local_110,(uint8_t *)local_d0,local_c8);
    local_f0.buf_[0x10] = local_b0.buf_[0x10];
    local_f0.buf_[0x11] = local_b0.buf_[0x11];
    local_f0.buf_[0x12] = local_b0.buf_[0x12];
    local_f0.buf_[0x13] = local_b0.buf_[0x13];
    local_f0.buf_[0x14] = local_b0.buf_[0x14];
    local_f0.buf_[0x15] = local_b0.buf_[0x15];
    local_f0.buf_[0x16] = local_b0.buf_[0x16];
    local_f0.buf_[0x17] = local_b0.buf_[0x17];
    local_f0.buf_[0x18] = local_b0.buf_[0x18];
    local_f0.buf_[0x19] = local_b0.buf_[0x19];
    local_f0.buf_[0x1a] = local_b0.buf_[0x1a];
    local_f0.buf_[0x1b] = local_b0.buf_[0x1b];
    local_f0.buf_[0x1c] = local_b0.buf_[0x1c];
    local_f0.buf_[0x1d] = local_b0.buf_[0x1d];
    local_f0.buf_[0x1e] = local_b0.buf_[0x1e];
    local_f0.buf_[0x1f] = local_b0.buf_[0x1f];
    local_f0.buf_[0] = local_b0.buf_[0];
    local_f0.buf_[1] = local_b0.buf_[1];
    local_f0.buf_[2] = local_b0.buf_[2];
    local_f0.buf_[3] = local_b0.buf_[3];
    local_f0.buf_[4] = local_b0.buf_[4];
    local_f0.buf_[5] = local_b0.buf_[5];
    local_f0.buf_[6] = local_b0.buf_[6];
    local_f0.buf_[7] = local_b0.buf_[7];
    local_f0.buf_[8] = local_b0.buf_[8];
    local_f0.buf_[9] = local_b0.buf_[9];
    local_f0.buf_[10] = local_b0.buf_[10];
    local_f0.buf_[0xb] = local_b0.buf_[0xb];
    local_f0.buf_[0xc] = local_b0.buf_[0xc];
    local_f0.buf_[0xd] = local_b0.buf_[0xd];
    local_f0.buf_[0xe] = local_b0.buf_[0xe];
    local_f0.buf_[0xf] = local_b0.buf_[0xf];
    (__return_storage_ptr__->super_type).m_initialized = false;
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
         (type)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->super_type).m_storage,local_110._0_8_,
               (pointer)(local_110._0_8_ + local_110._8_8_));
    *(ulong *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x30) =
         CONCAT44(local_f0.buf_._20_4_,local_f0.buf_._16_4_);
    *(ulong *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x38) =
         CONCAT44(local_f0.buf_._28_4_,local_f0.buf_._24_4_);
    *(ulong *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x20) =
         CONCAT44(local_f0.buf_._4_4_,local_f0.buf_._0_4_);
    *(ulong *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x28) =
         CONCAT44(local_f0.buf_._12_4_,local_f0.buf_._8_4_);
    (__return_storage_ptr__->super_type).m_initialized = true;
    SecretKey::~SecretKey(&local_f0);
    if ((STObject *)local_110._0_8_ != (STObject *)(local_110 + 0x10)) {
      operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    if (local_128.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.mData.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.mData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.mData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    STObject::~STObject(&local_90);
    SecretKey::~SecretKey(&local_b0);
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<ValidatorToken>
ValidatorKeys::createValidatorToken (
    KeyType const& keyType)
{
    if (revoked () ||
            std::numeric_limits<std::uint32_t>::max () - 1 <= tokenSequence_)
        return boost::none;

    ++tokenSequence_;

    auto const tokenSecret = generateSecretKey (keyType, randomSeed ());
    auto const tokenPublic = derivePublicKey(keyType, tokenSecret);

    STObject st(sfGeneric);
    st[sfSequence] = tokenSequence_;
    st[sfPublicKey] = publicKey_;
    st[sfSigningPubKey] = tokenPublic;

    jbcoin::sign(st, HashPrefix::manifest, keyType, tokenSecret);

    jbcoin::sign(st, HashPrefix::manifest, keyType_, secretKey_,
        sfMasterSignature);

    Serializer s;
    st.add(s);

    std::string m (static_cast<char const*> (s.data()), s.size());
    return ValidatorToken {
        beast::detail::base64_encode(m), tokenSecret };
}